

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv4Transmitter::Create
          (RTPUDPv4Transmitter *this,size_t maximumpacketsize,RTPTransmissionParams *transparams)

{
  RTPTransmissionParams *pRVar1;
  bool bVar2;
  bool rtcpMux;
  uint8_t uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  TransmissionProtocol TVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int iVar9;
  list<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  RTPAbortDescriptors *pRVar10;
  uint16_t local_d4;
  int status_3;
  uint16_t rtcpport;
  uint16_t rtpport;
  uint32_t bindIP;
  int status_2;
  int status_1;
  int local_ac;
  int status;
  uint size;
  sockaddr_in addr;
  undefined1 local_90 [8];
  RTPUDPv4TransmissionParams defaultparams;
  RTPUDPv4TransmissionParams *params;
  RTPTransmissionParams *transparams_local;
  size_t maximumpacketsize_local;
  RTPUDPv4Transmitter *this_local;
  
  RTPUDPv4TransmissionParams::RTPUDPv4TransmissionParams((RTPUDPv4TransmissionParams *)local_90);
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x5a;
  }
  else if ((this->created & 1U) == 0) {
    if (transparams == (RTPTransmissionParams *)0x0) {
      pRVar1 = (RTPTransmissionParams *)local_90;
    }
    else {
      TVar6 = RTPTransmissionParams::GetTransmissionProtocol(transparams);
      pRVar1 = transparams;
      if (TVar6 != IPv4UDPProto) {
        this_local._4_4_ = -0x53;
        goto LAB_0014f583;
      }
    }
    defaultparams.m_pAbortDesc = (RTPAbortDescriptors *)pRVar1;
    bVar2 = RTPUDPv4TransmissionParams::GetUseExistingSockets
                      ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc,&this->rtpsock,
                       &this->rtcpsock);
    if (bVar2) {
      this->closesocketswhendone = false;
      this_local._4_4_ = GetIPv4SocketPort(this->rtpsock,&this->m_rtpPort);
      if ((this_local._4_4_ < 0) ||
         (this_local._4_4_ = GetIPv4SocketPort(this->rtcpsock,&this->m_rtcpPort),
         this_local._4_4_ < 0)) goto LAB_0014f583;
    }
    else {
      this->closesocketswhendone = true;
      uVar4 = RTPUDPv4TransmissionParams::GetPortbase
                        ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
      if (uVar4 == 0) {
        uVar7 = RTPUDPv4TransmissionParams::GetBindIP
                          ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
        bVar2 = RTPUDPv4TransmissionParams::GetAllowOddPortbase
                          ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
        rtcpMux = RTPUDPv4TransmissionParams::GetRTCPMultiplexing
                            ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
        this_local._4_4_ =
             GetAutoSockets(uVar7,bVar2,rtcpMux,&this->rtpsock,&this->rtcpsock,&this->m_rtpPort,
                            &this->m_rtcpPort);
        if (this_local._4_4_ < 0) goto LAB_0014f583;
      }
      else {
        bVar2 = RTPUDPv4TransmissionParams::GetAllowOddPortbase
                          ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
        if ((!bVar2) &&
           (uVar4 = RTPUDPv4TransmissionParams::GetPortbase
                              ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc),
           (uint)uVar4 % 2 != 0)) {
          this_local._4_4_ = -0x5c;
          goto LAB_0014f583;
        }
        iVar9 = socket(2,2,0);
        this->rtpsock = iVar9;
        if (this->rtpsock == -1) {
          this_local._4_4_ = -0x4b;
          goto LAB_0014f583;
        }
        bVar2 = RTPUDPv4TransmissionParams::GetRTCPMultiplexing
                          ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
        if (bVar2) {
          this->rtcpsock = this->rtpsock;
        }
        else {
          iVar9 = socket(2,2,0);
          this->rtcpsock = iVar9;
          if (this->rtcpsock == -1) {
            close(this->rtpsock);
            this_local._4_4_ = -0x4b;
            goto LAB_0014f583;
          }
        }
        uVar7 = RTPUDPv4TransmissionParams::GetBindIP
                          ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
        uVar4 = RTPUDPv4TransmissionParams::GetPortbase
                          ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
        this->m_rtpPort = uVar4;
        addr.sin_family = 0;
        addr.sin_port = 0;
        addr.sin_addr.s_addr = 0;
        status._0_2_ = 2;
        status._2_1_ = '\0';
        status._3_1_ = '\0';
        size._0_1_ = '\0';
        size._1_1_ = '\0';
        size._2_1_ = '\0';
        size._3_1_ = '\0';
        uVar4 = RTPUDPv4TransmissionParams::GetPortbase
                          ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
        uVar5 = htons(uVar4);
        status = CONCAT22(uVar5,(sa_family_t)status);
        uVar8 = htonl(uVar7);
        size = uVar8;
        iVar9 = bind(this->rtpsock,(sockaddr *)&status,0x10);
        if (iVar9 != 0) {
          if ((this->closesocketswhendone & 1U) != 0) {
            if (this->rtpsock != this->rtcpsock) {
              close(this->rtcpsock);
            }
            close(this->rtpsock);
          }
          this_local._4_4_ = -0x4a;
          goto LAB_0014f583;
        }
        if (this->rtpsock == this->rtcpsock) {
          this->m_rtcpPort = this->m_rtpPort;
        }
        else {
          uVar4 = RTPUDPv4TransmissionParams::GetPortbase
                            ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
          local_d4 = RTPUDPv4TransmissionParams::GetForcedRTCPPort
                               ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
          if ((local_d4 == 0) && (local_d4 = uVar4, uVar4 != 0xffff)) {
            local_d4 = uVar4 + 1;
          }
          memset(&status,0,0x10);
          status._0_2_ = 2;
          uVar5 = htons(local_d4);
          status = CONCAT22(uVar5,(sa_family_t)status);
          uVar8 = htonl(uVar7);
          size = uVar8;
          iVar9 = bind(this->rtcpsock,(sockaddr *)&status,0x10);
          if (iVar9 != 0) {
            if ((this->closesocketswhendone & 1U) != 0) {
              if (this->rtpsock != this->rtcpsock) {
                close(this->rtcpsock);
              }
              close(this->rtpsock);
            }
            this_local._4_4_ = -0x49;
            goto LAB_0014f583;
          }
          this->m_rtcpPort = local_d4;
        }
      }
      local_ac = RTPUDPv4TransmissionParams::GetRTPReceiveBuffer
                           ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
      iVar9 = setsockopt(this->rtpsock,1,8,&local_ac,4);
      if (iVar9 != 0) {
        if ((this->closesocketswhendone & 1U) != 0) {
          if (this->rtpsock != this->rtcpsock) {
            close(this->rtcpsock);
          }
          close(this->rtpsock);
        }
        this_local._4_4_ = -0x4f;
        goto LAB_0014f583;
      }
      local_ac = RTPUDPv4TransmissionParams::GetRTPSendBuffer
                           ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
      iVar9 = setsockopt(this->rtpsock,1,7,&local_ac,4);
      if (iVar9 != 0) {
        if ((this->closesocketswhendone & 1U) != 0) {
          if (this->rtpsock != this->rtcpsock) {
            close(this->rtcpsock);
          }
          close(this->rtpsock);
        }
        this_local._4_4_ = -0x50;
        goto LAB_0014f583;
      }
      if (this->rtpsock != this->rtcpsock) {
        local_ac = RTPUDPv4TransmissionParams::GetRTCPReceiveBuffer
                             ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
        iVar9 = setsockopt(this->rtcpsock,1,8,&local_ac,4);
        if (iVar9 != 0) {
          if ((this->closesocketswhendone & 1U) != 0) {
            if (this->rtpsock != this->rtcpsock) {
              close(this->rtcpsock);
            }
            close(this->rtpsock);
          }
          this_local._4_4_ = -0x4d;
          goto LAB_0014f583;
        }
        local_ac = RTPUDPv4TransmissionParams::GetRTCPSendBuffer
                             ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
        iVar9 = setsockopt(this->rtcpsock,1,7,&local_ac,4);
        if (iVar9 != 0) {
          if ((this->closesocketswhendone & 1U) != 0) {
            if (this->rtpsock != this->rtcpsock) {
              close(this->rtcpsock);
            }
            close(this->rtpsock);
          }
          this_local._4_4_ = -0x4e;
          goto LAB_0014f583;
        }
      }
    }
    __x = RTPUDPv4TransmissionParams::GetLocalIPList_abi_cxx11_
                    ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->localIPs,__x);
    bVar2 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->localIPs);
    if ((bVar2) && (this_local._4_4_ = CreateLocalIPList(this), this_local._4_4_ < 0)) {
      if ((this->closesocketswhendone & 1U) != 0) {
        if (this->rtpsock != this->rtcpsock) {
          close(this->rtcpsock);
        }
        close(this->rtpsock);
      }
    }
    else {
      uVar3 = RTPUDPv4TransmissionParams::GetMulticastTTL
                        ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
      bVar2 = SetMulticastTTL(this,uVar3);
      if (bVar2) {
        this->supportsmulticasting = true;
      }
      else {
        this->supportsmulticasting = false;
      }
      if (maximumpacketsize < 0x10000) {
        pRVar10 = RTPUDPv4TransmissionParams::GetCreatedAbortDescriptors
                            ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
        if (pRVar10 == (RTPAbortDescriptors *)0x0) {
          this_local._4_4_ = RTPAbortDescriptors::Init(&this->m_abortDesc);
          if (this_local._4_4_ < 0) {
            if ((this->closesocketswhendone & 1U) != 0) {
              if (this->rtpsock != this->rtcpsock) {
                close(this->rtcpsock);
              }
              close(this->rtpsock);
            }
            goto LAB_0014f583;
          }
          this->m_pAbortDesc = &this->m_abortDesc;
        }
        else {
          pRVar10 = RTPUDPv4TransmissionParams::GetCreatedAbortDescriptors
                              ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
          this->m_pAbortDesc = pRVar10;
          bVar2 = RTPAbortDescriptors::IsInitialized(this->m_pAbortDesc);
          if (!bVar2) {
            if ((this->closesocketswhendone & 1U) != 0) {
              if (this->rtpsock != this->rtcpsock) {
                close(this->rtcpsock);
              }
              close(this->rtpsock);
            }
            this_local._4_4_ = -0xae;
            goto LAB_0014f583;
          }
        }
        this->maxpacksize = maximumpacketsize;
        uVar3 = RTPUDPv4TransmissionParams::GetMulticastTTL
                          ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
        this->multicastTTL = uVar3;
        uVar7 = RTPUDPv4TransmissionParams::GetMulticastInterfaceIP
                          ((RTPUDPv4TransmissionParams *)defaultparams.m_pAbortDesc);
        this->mcastifaceIP = uVar7;
        this->receivemode = AcceptAll;
        this->localhostname = (uint8_t *)0x0;
        this->localhostnamelength = 0;
        this->waitingfordata = false;
        this->created = true;
        this_local._4_4_ = 0;
      }
      else {
        if ((this->closesocketswhendone & 1U) != 0) {
          if (this->rtpsock != this->rtcpsock) {
            close(this->rtcpsock);
          }
          close(this->rtpsock);
        }
        this_local._4_4_ = -0x5d;
      }
    }
  }
  else {
    this_local._4_4_ = -0x46;
  }
LAB_0014f583:
  RTPUDPv4TransmissionParams::~RTPUDPv4TransmissionParams((RTPUDPv4TransmissionParams *)local_90);
  return this_local._4_4_;
}

Assistant:

int RTPUDPv4Transmitter::Create(size_t maximumpacketsize,const RTPTransmissionParams *transparams)
{
	const RTPUDPv4TransmissionParams *params,defaultparams;
	struct sockaddr_in addr;
	RTPSOCKLENTYPE size;
	int status;

	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_ALREADYCREATED;
	}
	
	// Obtain transmission parameters
	
	if (transparams == 0)
		params = &defaultparams;
	else
	{
		if (transparams->GetTransmissionProtocol() != RTPTransmitter::IPv4UDPProto)
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV4TRANS_ILLEGALPARAMETERS;
		}
		params = (const RTPUDPv4TransmissionParams *)transparams;
	}

	if (params->GetUseExistingSockets(rtpsock, rtcpsock))
	{
		closesocketswhendone = false;

		// Determine the port numbers
		int status = GetIPv4SocketPort(rtpsock, &m_rtpPort);
		if (status < 0)
		{
			MAINMUTEX_UNLOCK
			return status;
		}
		status = GetIPv4SocketPort(rtcpsock, &m_rtcpPort);
		if (status < 0)
		{
			MAINMUTEX_UNLOCK
			return status;
		}
	}
	else
	{
		closesocketswhendone = true;

		if (params->GetPortbase() == 0)
		{
			int status = GetAutoSockets(params->GetBindIP(), params->GetAllowOddPortbase(), params->GetRTCPMultiplexing(),
			                            &rtpsock, &rtcpsock, &m_rtpPort, &m_rtcpPort);
			if (status < 0)
			{
				MAINMUTEX_UNLOCK
				return status;
			}
		}
		else
		{
			// Check if portbase is even (if necessary)
			if (!params->GetAllowOddPortbase() && params->GetPortbase()%2 != 0)
			{
				MAINMUTEX_UNLOCK
				return ERR_RTP_UDPV4TRANS_PORTBASENOTEVEN;
			}

			// create sockets
			
			rtpsock = socket(PF_INET,SOCK_DGRAM,0);
			if (rtpsock == RTPSOCKERR)
			{
				MAINMUTEX_UNLOCK
				return ERR_RTP_UDPV4TRANS_CANTCREATESOCKET;
			}

			// If we're multiplexing, we're just going to set the RTCP socket to equal the RTP socket
			if (params->GetRTCPMultiplexing())
				rtcpsock = rtpsock;
			else
			{
				rtcpsock = socket(PF_INET,SOCK_DGRAM,0);
				if (rtcpsock == RTPSOCKERR)
				{
					RTPCLOSE(rtpsock);
					MAINMUTEX_UNLOCK
					return ERR_RTP_UDPV4TRANS_CANTCREATESOCKET;
				}
			}

			// bind sockets

			uint32_t bindIP = params->GetBindIP();
			
			m_rtpPort = params->GetPortbase();

			memset(&addr,0,sizeof(struct sockaddr_in));
			addr.sin_family = AF_INET;
			addr.sin_port = htons(params->GetPortbase());
			addr.sin_addr.s_addr = htonl(bindIP);
			if (bind(rtpsock,(struct sockaddr *)&addr,sizeof(struct sockaddr_in)) != 0)
			{
				CLOSESOCKETS;
				MAINMUTEX_UNLOCK
				return ERR_RTP_UDPV4TRANS_CANTBINDRTPSOCKET;
			}

			if (rtpsock != rtcpsock) // no need to bind same socket twice when multiplexing
			{
				uint16_t rtpport = params->GetPortbase();
				uint16_t rtcpport = params->GetForcedRTCPPort();

				if (rtcpport == 0)
				{
					rtcpport = rtpport;
					if (rtcpport < 0xFFFF)
						rtcpport++;
				}

				memset(&addr,0,sizeof(struct sockaddr_in));
				addr.sin_family = AF_INET;
				addr.sin_port = htons(rtcpport);
				addr.sin_addr.s_addr = htonl(bindIP);
				if (bind(rtcpsock,(struct sockaddr *)&addr,sizeof(struct sockaddr_in)) != 0)
				{
					CLOSESOCKETS;
					MAINMUTEX_UNLOCK
					return ERR_RTP_UDPV4TRANS_CANTBINDRTCPSOCKET;
				}

				m_rtcpPort = rtcpport;
			}
			else
				m_rtcpPort = m_rtpPort;
		}

		// set socket buffer sizes
		
		size = params->GetRTPReceiveBuffer();
		if (setsockopt(rtpsock,SOL_SOCKET,SO_RCVBUF,(const char *)&size,sizeof(int)) != 0)
		{
			CLOSESOCKETS;
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV4TRANS_CANTSETRTPRECEIVEBUF;
		}
		size = params->GetRTPSendBuffer();
		if (setsockopt(rtpsock,SOL_SOCKET,SO_SNDBUF,(const char *)&size,sizeof(int)) != 0)
		{
			CLOSESOCKETS;
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV4TRANS_CANTSETRTPTRANSMITBUF;
		}

		if (rtpsock != rtcpsock) // no need to set RTCP flags when multiplexing
		{
			size = params->GetRTCPReceiveBuffer();
			if (setsockopt(rtcpsock,SOL_SOCKET,SO_RCVBUF,(const char *)&size,sizeof(int)) != 0)
			{
				CLOSESOCKETS;
				MAINMUTEX_UNLOCK
				return ERR_RTP_UDPV4TRANS_CANTSETRTCPRECEIVEBUF;
			}
			size = params->GetRTCPSendBuffer();
			if (setsockopt(rtcpsock,SOL_SOCKET,SO_SNDBUF,(const char *)&size,sizeof(int)) != 0)
			{
				CLOSESOCKETS;
				MAINMUTEX_UNLOCK
				return ERR_RTP_UDPV4TRANS_CANTSETRTCPTRANSMITBUF;
			}
		}
	}

	// Try to obtain local IP addresses

	localIPs = params->GetLocalIPList();
	if (localIPs.empty()) // User did not provide list of local IP addresses, calculate them
	{
		int status;
		
		if ((status = CreateLocalIPList()) < 0)
		{
			CLOSESOCKETS;
			MAINMUTEX_UNLOCK
			return status;
		}
#ifdef RTPDEBUG
		std::cout << "Found these local IP addresses:" << std::endl;
		
		std::list<uint32_t>::const_iterator it;

		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			RTPIPv4Address a(*it);

			std::cout << a.GetAddressString() << std::endl;
		}
#endif // RTPDEBUG
	}

#ifdef RTP_SUPPORT_IPV4MULTICAST
	if (SetMulticastTTL(params->GetMulticastTTL()))
		supportsmulticasting = true;
	else
		supportsmulticasting = false;
#else // no multicast support enabled
	supportsmulticasting = false;
#endif // RTP_SUPPORT_IPV4MULTICAST

	if (maximumpacketsize > RTPUDPV4TRANS_MAXPACKSIZE)
	{
		CLOSESOCKETS;
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_SPECIFIEDSIZETOOBIG;
	}
	
	if (!params->GetCreatedAbortDescriptors())
	{
		if ((status = m_abortDesc.Init()) < 0)
		{
			CLOSESOCKETS;
			MAINMUTEX_UNLOCK
			return status;
		}
		m_pAbortDesc = &m_abortDesc;
	}
	else
	{
		m_pAbortDesc = params->GetCreatedAbortDescriptors();
		if (!m_pAbortDesc->IsInitialized())
		{
			CLOSESOCKETS;
			MAINMUTEX_UNLOCK
			return ERR_RTP_ABORTDESC_NOTINIT;
		}
	}

	maxpacksize = maximumpacketsize;
	multicastTTL = params->GetMulticastTTL();
	mcastifaceIP = params->GetMulticastInterfaceIP();
	receivemode = RTPTransmitter::AcceptAll;

	localhostname = 0;
	localhostnamelength = 0;

	waitingfordata = false;
	created = true;
	MAINMUTEX_UNLOCK 
	return 0;
}